

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

bool ImGui::BeginTableEx(char *name,ImGuiID id,int columns_count,ImGuiTableFlags flags,
                        ImVec2 *outer_size,float inner_width)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  short sVar3;
  ImGuiWindow *pIVar4;
  ImGuiWindow *pIVar5;
  ImGuiPtrOrIndex *__src;
  float *__src_00;
  ImGuiContext *pIVar6;
  bool bVar7;
  ImU32 IVar8;
  int iVar9;
  ImGuiTableColumn *p;
  ImGuiTable *p_00;
  ImGuiPtrOrIndex *__dest;
  float *__dest_00;
  void *__s;
  ImGuiTableColumn *pIVar10;
  char *__dest_01;
  ImS16 IVar11;
  int iVar12;
  ImRect *pIVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  ImGuiContext *g;
  uint uVar18;
  uint uVar19;
  ImGuiID id_00;
  ulong uVar20;
  ImGuiTableColumn *pIVar21;
  char *pcVar22;
  int iVar23;
  ImGuiTableCellData *pIVar24;
  undefined4 in_XMM0_Db;
  ImVec2 IVar25;
  undefined8 extraout_XMM0_Qb;
  ImVec2 IVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar33 [16];
  ImRect outer_rect;
  ImRect local_a8;
  undefined8 local_98;
  ImPool<ImGuiTable> *local_80;
  ImVec2 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined3 uStack_50;
  undefined5 uStack_4d;
  undefined4 local_48;
  undefined4 local_44;
  undefined3 uStack_40;
  
  pIVar6 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  pIVar4->WriteAccessed = true;
  if (pIVar4->SkipItems != false) {
    return false;
  }
  uVar14 = (ulong)(uint)columns_count;
  if (0x3f < columns_count - 1U) {
    __assert_fail("columns_count > 0 && columns_count <= 64 && \"Only 1..64 columns allowed!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O3/_deps/imgui-src/imgui_tables.cpp"
                  ,0x133,
                  "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                 );
  }
  if ((((uint)flags >> 0x18 & 1) != 0) && (inner_width < 0.0)) {
    __assert_fail("inner_width >= 0.0f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O3/_deps/imgui-src/imgui_tables.cpp"
                  ,0x135,
                  "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                 );
  }
  local_98 = CONCAT44(in_XMM0_Db,inner_width);
  IVar25 = GetContentRegionAvail();
  fVar29 = IVar25.y;
  auVar28._8_4_ = (int)extraout_XMM0_Qb;
  auVar28._0_4_ = IVar25.x;
  auVar28._4_4_ = IVar25.y;
  auVar28._12_4_ = (int)((ulong)extraout_XMM0_Qb >> 0x20);
  if (IVar25.x <= 1.0) {
    auVar28._0_4_ = 0x3f800000;
  }
  if ((flags & 0x3000000U) == 0) {
    IVar25 = CalcItemSize(*outer_size,auVar28._0_4_,0.0);
    local_a8.Min = (pIVar4->DC).CursorPos;
    local_a8.Max.x = IVar25.x + local_a8.Min.x;
    local_a8.Max.y = IVar25.y + local_a8.Min.y;
  }
  else {
    if (fVar29 <= 1.0) {
      fVar29 = 1.0;
    }
    IVar25 = CalcItemSize(*outer_size,auVar28._0_4_,fVar29);
    local_a8.Min = (pIVar4->DC).CursorPos;
    local_a8.Max.x = IVar25.x + local_a8.Min.x;
    local_a8.Max.y = IVar25.y + local_a8.Min.y;
    bVar7 = IsClippedEx(&local_a8,0,false);
    if (bVar7) {
      ItemSize(&local_a8,-1.0);
      return false;
    }
  }
  local_80 = &pIVar6->Tables;
  p_00 = ImPool<ImGuiTable>::GetOrAddByKey(local_80,id);
  iVar9 = pIVar6->FrameCount;
  if (p_00->LastFrameActive == iVar9) {
    sVar3 = p_00->InstanceCurrent;
    IVar11 = sVar3 + 1;
    id_00 = (int)sVar3 + id + 1;
    uVar19 = p_00->Flags;
    if ((-1 < sVar3) && (p_00->ColumnsCount != columns_count)) {
      __assert_fail("table->ColumnsCount == columns_count && \"BeginTable(): Cannot change columns count mid-frame while preserving same ID\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O3/_deps/imgui-src/imgui_tables.cpp"
                    ,0x148,
                    "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                   );
    }
  }
  else {
    uVar19 = p_00->Flags;
    IVar11 = 0;
    id_00 = id;
  }
  uVar15 = flags & 0xe000;
  p_00->IsDefaultSizingPolicy = uVar15 == 0;
  uVar18 = flags;
  if (uVar15 == 0) {
    uVar15 = 0x2000;
    if ((((uint)flags >> 0x18 & 1) == 0) && (uVar15 = 0x2000, (pIVar4->Flags & 0x40) == 0)) {
      uVar15 = 0x8000;
    }
    uVar18 = uVar15 | flags;
  }
  uVar16 = uVar18 | 0x40000;
  if (uVar15 != 0x4000) {
    uVar16 = uVar18;
  }
  uVar18 = uVar16 & 0xfffcffff;
  if ((uVar16 & 0x3000000) == 0) {
    uVar18 = uVar16;
  }
  uVar15 = uVar18 & 0xfffff7ff;
  if ((uVar18 >> 0xc & 1) == 0) {
    uVar15 = uVar18;
  }
  uVar18 = (uVar16 & 1) << 9 | uVar15;
  uVar16 = uVar18 | 0x10;
  if ((uVar15 & 0xf) == 0) {
    uVar18 = uVar16;
  }
  if (((uint)pIVar4->RootWindow->Flags >> 8 & 1) != 0) {
    uVar18 = uVar16;
  }
  p_00->ID = id;
  p_00->Flags = uVar18;
  p_00->InstanceCurrent = IVar11;
  p_00->LastFrameActive = iVar9;
  p_00->InnerWindow = pIVar4;
  p_00->OuterWindow = pIVar4;
  p_00->ColumnsCount = columns_count;
  p_00->IsLayoutLocked = false;
  p_00->InnerWidth = (float)local_98;
  p_00->UserOuterSize = *outer_size;
  local_98 = uVar14;
  if ((flags & 0x3000000U) == 0) {
    (p_00->InnerRect).Min = local_a8.Min;
    (p_00->InnerRect).Max = local_a8.Max;
    (p_00->OuterRect).Min = local_a8.Min;
    (p_00->OuterRect).Max = local_a8.Max;
    (p_00->WorkRect).Min = local_a8.Min;
    (p_00->WorkRect).Max = local_a8.Max;
  }
  else {
    fVar29 = (float)local_98;
    if ((uVar18 & 0x1000000) == 0) {
      fVar29 = 3.4028235e+38;
    }
    fVar29 = (float)(~-(uint)(0.0 < (float)local_98) & 0x7f7fffff |
                    (uint)fVar29 & -(uint)(0.0 < (float)local_98));
    if (fVar29 != 3.4028235e+38 || (uVar18 & 0x3000000) == 0x1000000) {
      if ((uVar18 & 0x3000000) == 0x1000000) {
        local_78.y = 1.1754944e-38;
      }
      else {
        local_78.y = 0.0;
      }
      local_78.x = (float)(-(uint)(fVar29 != 3.4028235e+38) & (uint)fVar29);
      SetNextWindowContentSize(&local_78);
    }
    if ((uVar19 & 0x3000000) == 0) {
      local_78.x = 0.0;
      local_78.y = 0.0;
      SetNextWindowScroll(&local_78);
    }
    local_78.x = local_a8.Max.x - local_a8.Min.x;
    local_78.y = local_a8.Max.y - local_a8.Min.y;
    BeginChildEx(name,id_00,&local_78,false,(uVar18 & 0x1000000) >> 0xd);
    pIVar5 = pIVar6->CurrentWindow;
    p_00->InnerWindow = pIVar5;
    IVar25 = (pIVar5->WorkRect).Max;
    (p_00->WorkRect).Min = (pIVar5->WorkRect).Min;
    (p_00->WorkRect).Max = IVar25;
    IVar25 = pIVar5->Pos;
    IVar26.x = (pIVar5->Size).x + IVar25.x;
    IVar26.y = (pIVar5->Size).y + IVar25.y;
    (p_00->OuterRect).Min = IVar25;
    (p_00->OuterRect).Max = IVar26;
    IVar25 = (pIVar5->InnerRect).Max;
    (p_00->InnerRect).Min = (pIVar5->InnerRect).Min;
    (p_00->InnerRect).Max = IVar25;
    if (((((pIVar5->WindowPadding).x != 0.0) || (fVar29 = (pIVar5->WindowPadding).y, fVar29 != 0.0))
        || (NAN(fVar29))) || ((pIVar5->WindowBorderSize != 0.0 || (NAN(pIVar5->WindowBorderSize)))))
    {
      __assert_fail("table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O3/_deps/imgui-src/imgui_tables.cpp"
                    ,0x177,
                    "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                   );
    }
  }
  PushOverrideID(id_00);
  pIVar5 = p_00->InnerWindow;
  p_00->HostIndentX = (pIVar5->DC).Indent.x;
  IVar25 = (pIVar5->ClipRect).Max;
  (p_00->HostClipRect).Min = (pIVar5->ClipRect).Min;
  (p_00->HostClipRect).Max = IVar25;
  p_00->HostSkipItems = pIVar5->SkipItems;
  IVar25 = (pIVar5->WorkRect).Max;
  (p_00->HostBackupWorkRect).Min = (pIVar5->WorkRect).Min;
  (p_00->HostBackupWorkRect).Max = IVar25;
  IVar25 = (pIVar5->ParentWorkRect).Max;
  (p_00->HostBackupParentWorkRect).Min = (pIVar5->ParentWorkRect).Min;
  (p_00->HostBackupParentWorkRect).Max = IVar25;
  (p_00->HostBackupColumnsOffset).x = (pIVar4->DC).ColumnsOffset.x;
  p_00->HostBackupPrevLineSize = (pIVar5->DC).PrevLineSize;
  p_00->HostBackupCurrLineSize = (pIVar5->DC).CurrLineSize;
  p_00->HostBackupCursorMaxPos = (pIVar5->DC).CursorMaxPos;
  p_00->HostBackupItemWidth = (pIVar4->DC).ItemWidth;
  p_00->HostBackupItemWidthStackSize = (pIVar4->DC).ItemWidthStack.Size;
  fVar29 = 0.0;
  fVar31 = 0.0;
  if ((uVar18 >> 9 & 1) != 0) {
    fVar31 = 1.0;
  }
  (pIVar5->DC).CurrLineSize.x = 0.0;
  (pIVar5->DC).CurrLineSize.y = 0.0;
  (pIVar5->DC).PrevLineSize.x = 0.0;
  (pIVar5->DC).PrevLineSize.y = 0.0;
  if ((uVar18 & 0x800200) == 0x200) {
    fVar29 = (pIVar6->Style).CellPadding.x;
LAB_0015949e:
    fVar30 = 0.0;
  }
  else {
    if ((uVar18 & 0x800200) != 0) goto LAB_0015949e;
    fVar30 = (pIVar6->Style).CellPadding.x;
  }
  p_00->CellSpacingX1 = fVar31 + fVar30;
  p_00->CellSpacingX2 = fVar30;
  p_00->CellPaddingX = fVar29;
  p_00->CellPaddingY = (pIVar6->Style).CellPadding.y;
  fVar31 = 0.0;
  fVar30 = 0.0;
  if ((uVar18 >> 10 & 1) != 0) {
    fVar30 = 1.0;
  }
  if ((uVar18 >> 0x16 & 1) == 0 && (uVar18 & 0x200400) != 0) {
    fVar31 = (pIVar6->Style).CellPadding.x;
  }
  p_00->OuterPaddingX = (fVar30 + fVar31) - fVar29;
  p_00->CurrentRow = -1;
  p_00->CurrentColumn = -1;
  p_00->RowBgColorCounter = 0;
  *(uint *)&p_00->field_0x90 = (uint)*(ushort *)&p_00->field_0x90;
  pIVar13 = &pIVar5->ClipRect;
  if (pIVar5 == pIVar4) {
    pIVar13 = &p_00->WorkRect;
  }
  IVar25 = pIVar13->Max;
  (p_00->InnerClipRect).Min = pIVar13->Min;
  (p_00->InnerClipRect).Max = IVar25;
  IVar25 = (p_00->InnerClipRect).Min;
  auVar27._8_8_ = 0;
  auVar27._0_4_ = (p_00->InnerClipRect).Max.x;
  auVar27._4_4_ = (p_00->InnerClipRect).Max.y;
  IVar26 = (p_00->WorkRect).Min;
  fVar30 = IVar26.x;
  fVar32 = IVar26.y;
  auVar33._8_8_ = 0;
  auVar33._0_4_ = (p_00->WorkRect).Max.x;
  auVar33._4_4_ = (p_00->WorkRect).Max.y;
  auVar28 = minps(auVar27,auVar33);
  fVar29 = IVar25.x;
  fVar31 = IVar25.y;
  uVar15 = -(uint)(fVar30 <= fVar29);
  uVar16 = -(uint)(fVar32 <= fVar31);
  (p_00->InnerClipRect).Min =
       (ImVec2)(CONCAT44(~uVar16 & (uint)fVar32,~uVar15 & (uint)fVar30) |
               CONCAT44((uint)fVar31 & uVar16,(uint)fVar29 & uVar15));
  (p_00->InnerClipRect).Max = auVar28._0_8_;
  ImRect::ClipWithFull(&p_00->InnerClipRect,&p_00->HostClipRect);
  if ((uVar18 >> 0x11 & 1) == 0) {
    fVar29 = (pIVar5->ClipRect).Max.y;
  }
  else {
    fVar29 = (p_00->InnerClipRect).Max.y;
    fVar31 = (pIVar5->WorkRect).Max.y;
    if (fVar31 <= fVar29) {
      fVar29 = fVar31;
    }
  }
  (p_00->InnerClipRect).Max.y = fVar29;
  fVar29 = (p_00->WorkRect).Min.y;
  p_00->RowPosY2 = fVar29;
  p_00->RowPosY1 = fVar29;
  p_00->RowTextBaseline = 0.0;
  p_00->FreezeRowsRequest = '\0';
  p_00->FreezeRowsCount = '\0';
  p_00->FreezeColumnsRequest = '\0';
  p_00->FreezeColumnsCount = '\0';
  p_00->IsUnfrozenRows = true;
  p_00->DeclColumnsCount = '\0';
  IVar8 = GetColorU32(0x2b,1.0);
  p_00->BorderColorStrong = IVar8;
  IVar8 = GetColorU32(0x2c,1.0);
  p_00->BorderColorLight = IVar8;
  uVar15 = ImPool<ImGuiTable>::GetIndex(local_80,p_00);
  iVar9 = (pIVar6->CurrentTableStack).Size;
  if (iVar9 == (pIVar6->CurrentTableStack).Capacity) {
    if (iVar9 == 0) {
      iVar12 = 8;
    }
    else {
      iVar12 = iVar9 / 2 + iVar9;
    }
    iVar23 = iVar9 + 1;
    if (iVar9 + 1 < iVar12) {
      iVar23 = iVar12;
    }
    __dest = (ImGuiPtrOrIndex *)MemAlloc((long)iVar23 << 4);
    __src = (pIVar6->CurrentTableStack).Data;
    if (__src != (ImGuiPtrOrIndex *)0x0) {
      memcpy(__dest,__src,(long)(pIVar6->CurrentTableStack).Size << 4);
      MemFree((pIVar6->CurrentTableStack).Data);
    }
    (pIVar6->CurrentTableStack).Data = __dest;
    (pIVar6->CurrentTableStack).Capacity = iVar23;
    iVar9 = (pIVar6->CurrentTableStack).Size;
  }
  else {
    __dest = (pIVar6->CurrentTableStack).Data;
  }
  __dest[iVar9].Ptr = (void *)0x0;
  __dest[iVar9].Index = uVar15;
  (pIVar6->CurrentTableStack).Size = (pIVar6->CurrentTableStack).Size + 1;
  pIVar6->CurrentTable = p_00;
  (pIVar4->DC).CurrentTableIdx = uVar15;
  if (pIVar5 != pIVar4) {
    (pIVar5->DC).CurrentTableIdx = uVar15;
  }
  if (((uVar19 & 2) != 0) && ((uVar18 & 2) == 0)) {
    p_00->IsResetDisplayOrderRequest = true;
  }
  iVar9 = (pIVar6->TablesLastTimeActive).Size;
  if (iVar9 <= (int)uVar15) {
    iVar12 = uVar15 + 1;
    iVar23 = (pIVar6->TablesLastTimeActive).Capacity;
    if (iVar23 <= (int)uVar15) {
      if (iVar23 == 0) {
        iVar23 = 8;
      }
      else {
        iVar23 = iVar23 / 2 + iVar23;
      }
      if (iVar23 <= iVar12) {
        iVar23 = iVar12;
      }
      __dest_00 = (float *)MemAlloc((long)iVar23 << 2);
      __src_00 = (pIVar6->TablesLastTimeActive).Data;
      if (__src_00 != (float *)0x0) {
        memcpy(__dest_00,__src_00,(long)(pIVar6->TablesLastTimeActive).Size << 2);
        MemFree((pIVar6->TablesLastTimeActive).Data);
      }
      (pIVar6->TablesLastTimeActive).Data = __dest_00;
      (pIVar6->TablesLastTimeActive).Capacity = iVar23;
      iVar9 = (pIVar6->TablesLastTimeActive).Size;
    }
    if (iVar9 <= (int)uVar15) {
      lVar17 = (long)iVar9;
      do {
        (pIVar6->TablesLastTimeActive).Data[lVar17] = -1.0;
        lVar17 = lVar17 + 1;
      } while (iVar12 != lVar17);
    }
    (pIVar6->TablesLastTimeActive).Size = iVar12;
    iVar9 = iVar12;
  }
  uVar14 = local_98;
  if (((int)uVar15 < 0) || (iVar9 <= (int)uVar15)) {
    __assert_fail("i >= 0 && i < Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O3/_deps/imgui-src/imgui.h"
                  ,0x65c,"T &ImVector<float>::operator[](int) [T = float]");
  }
  (pIVar6->TablesLastTimeActive).Data[uVar15] = (float)pIVar6->Time;
  p_00->MemoryCompacted = false;
  iVar9 = (int)((ulong)((long)(p_00->Columns).DataEnd - (long)(p_00->Columns).Data) >> 3) *
          -0x3b13b13b;
  iVar12 = (int)local_98;
  if (iVar9 == iVar12 || iVar9 == 0) {
    if (p_00->RawData == (void *)0x0) goto LAB_00159857;
  }
  else {
    MemFree(p_00->RawData);
    p_00->RawData = (void *)0x0;
LAB_00159857:
    uVar20 = (ulong)(uint)(iVar12 * 0x71);
    __s = MemAlloc(uVar20);
    p_00->RawData = __s;
    memset(__s,0,uVar20);
    pIVar10 = (ImGuiTableColumn *)p_00->RawData;
    pIVar21 = (ImGuiTableColumn *)((long)&pIVar10->Flags + (ulong)(uint)(iVar12 * 0x68));
    (p_00->Columns).Data = pIVar10;
    (p_00->Columns).DataEnd = pIVar21;
    pIVar24 = (ImGuiTableCellData *)((long)&pIVar10->Flags + (ulong)(uint)(iVar12 * 0x69));
    (p_00->DisplayOrderToIndex).Data = (char *)pIVar21;
    (p_00->DisplayOrderToIndex).DataEnd = (char *)pIVar24;
    (p_00->RowCellData).Data = pIVar24;
    (p_00->RowCellData).DataEnd = (ImGuiTableCellData *)((long)&pIVar10->Flags + uVar20);
    p_00->IsSettingsRequestLoad = true;
    p_00->IsInitializing = true;
  }
  if (p_00->IsResetAllRequest == true) {
    p_00->IsInitializing = true;
    p_00->IsResetAllRequest = false;
    p_00->IsSettingsRequestLoad = false;
    p_00->IsSettingsDirty = true;
    p_00->SettingsLoadedFlags = 0;
  }
  else if ((p_00->IsInitializing & 1U) == 0) goto LAB_00159a18;
  p_00->SettingsOffset = -1;
  p_00->IsSortSpecsDirty = true;
  p_00->InstanceInteracted = -1;
  p_00->ContextPopupColumn = -1;
  p_00->ReorderColumn = -1;
  p_00->HoveredColumnBody = -1;
  p_00->HoveredColumnBorder = -1;
  p_00->AutoFitSingleColumn = -1;
  p_00->ResizedColumn = -1;
  p_00->LastResizedColumn = -1;
  if (0 < iVar12) {
    lVar17 = 0x60;
    uVar20 = 0;
    do {
      pIVar10 = (p_00->Columns).Data;
      pIVar21 = (ImGuiTableColumn *)((long)pIVar10 + lVar17 + -0x60);
      if ((p_00->Columns).DataEnd <= pIVar21) goto LAB_00159b0d;
      uVar2 = *(undefined4 *)((long)pIVar10 + lVar17 + -0x4c);
      local_48 = 0;
      local_58 = 0;
      uStack_50 = 0;
      uStack_4d = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_78.x = 0.0;
      local_78.y = 0.0;
      uStack_70 = 0;
      uStack_40 = 0xffffff;
      local_44 = 0xffffffff;
      pIVar21->Flags = 0;
      pIVar21->WidthGiven = 0.0;
      *(undefined8 *)((long)pIVar10 + lVar17 + -0x58) = 0;
      *(undefined4 *)((long)pIVar10 + lVar17 + -0x50) = 0xbf800000;
      *(undefined4 *)((long)pIVar10 + lVar17 + -0x48) = 0xbf800000;
      puVar1 = (undefined8 *)((long)pIVar10 + lVar17 + -0x44);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)pIVar10 + lVar17 + -0x34);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)pIVar10 + lVar17 + -0x24);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)pIVar10 + lVar17 + -0x19);
      *puVar1 = 0;
      puVar1[1] = 0xffffffffffffff00;
      *(undefined2 *)((long)pIVar10 + lVar17 + -9) = 0xffff;
      *(undefined1 *)((long)pIVar10 + lVar17 + -7) = 0xff;
      *(undefined4 *)((long)&pIVar10->Flags + lVar17 + 2) = 0;
      *(undefined8 *)((long)pIVar10 + lVar17 + -6) = 0;
      *(undefined4 *)((long)pIVar10 + lVar17 + -0x4c) = uVar2;
      *(undefined1 *)((long)&pIVar10->Flags + lVar17) = 1;
      pcVar22 = (p_00->DisplayOrderToIndex).Data + uVar20;
      if ((p_00->DisplayOrderToIndex).DataEnd <= pcVar22) {
        pcVar22 = "T &ImSpan<signed char>::operator[](int) [T = signed char]";
        goto LAB_00159b39;
      }
      *pcVar22 = (char)uVar20;
      *(char *)((long)pIVar10 + lVar17 + -0xe) = (char)uVar20;
      *(undefined2 *)((long)pIVar10 + lVar17 + -6) = 0x101;
      uVar20 = uVar20 + 1;
      lVar17 = lVar17 + 0x68;
    } while ((uVar14 & 0xffffffff) != uVar20);
  }
LAB_00159a18:
  if (p_00->IsSettingsRequestLoad == true) {
    TableLoadSettings(p_00);
  }
  fVar29 = pIVar6->FontSize;
  fVar31 = p_00->RefScale;
  if ((fVar31 != 0.0) || (NAN(fVar31))) {
    if (((fVar31 != fVar29) || (NAN(fVar31) || NAN(fVar29))) && (0 < iVar12)) {
      pIVar10 = (p_00->Columns).Data;
      uVar14 = uVar14 & 0xffffffff;
      do {
        if ((p_00->Columns).DataEnd <= pIVar10) {
LAB_00159b0d:
          pcVar22 = "T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]";
LAB_00159b39:
          __assert_fail("p >= Data && p < DataEnd",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O3/_deps/imgui-src/imgui_internal.h"
                        ,0x20e,pcVar22);
        }
        pIVar10->WidthRequest = pIVar10->WidthRequest * (fVar29 / fVar31);
        pIVar10 = pIVar10 + 1;
        uVar14 = uVar14 - 1;
      } while (uVar14 != 0);
    }
  }
  p_00->RefScale = fVar29;
  pIVar5->SkipItems = true;
  if (0 < (p_00->ColumnsNames).Buf.Size) {
    if ((p_00->ColumnsNames).Buf.Capacity < 0) {
      __dest_01 = (char *)MemAlloc(0);
      pcVar22 = (p_00->ColumnsNames).Buf.Data;
      if (pcVar22 != (char *)0x0) {
        memcpy(__dest_01,pcVar22,(long)(p_00->ColumnsNames).Buf.Size);
        MemFree((p_00->ColumnsNames).Buf.Data);
      }
      (p_00->ColumnsNames).Buf.Data = __dest_01;
      (p_00->ColumnsNames).Buf.Capacity = 0;
    }
    (p_00->ColumnsNames).Buf.Size = 0;
  }
  TableBeginApplyRequests(p_00);
  return true;
}

Assistant:

bool    ImGui::BeginTableEx(const char* name, ImGuiID id, int columns_count, ImGuiTableFlags flags, const ImVec2& outer_size, float inner_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* outer_window = GetCurrentWindow();
    if (outer_window->SkipItems) // Consistent with other tables + beneficial side effect that assert on miscalling EndTable() will be more visible.
        return false;

    // Sanity checks
    IM_ASSERT(columns_count > 0 && columns_count <= IMGUI_TABLE_MAX_COLUMNS && "Only 1..64 columns allowed!");
    if (flags & ImGuiTableFlags_ScrollX)
        IM_ASSERT(inner_width >= 0.0f);

    // If an outer size is specified ahead we will be able to early out when not visible. Exact clipping rules may evolve.
    const bool use_child_window = (flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) != 0;
    const ImVec2 avail_size = GetContentRegionAvail();
    ImVec2 actual_outer_size = CalcItemSize(outer_size, ImMax(avail_size.x, 1.0f), use_child_window ? ImMax(avail_size.y, 1.0f) : 0.0f);
    ImRect outer_rect(outer_window->DC.CursorPos, outer_window->DC.CursorPos + actual_outer_size);
    if (use_child_window && IsClippedEx(outer_rect, 0, false))
    {
        ItemSize(outer_rect);
        return false;
    }

    // Acquire storage for the table
    ImGuiTable* table = g.Tables.GetOrAddByKey(id);
    const int instance_no = (table->LastFrameActive != g.FrameCount) ? 0 : table->InstanceCurrent + 1;
    const ImGuiID instance_id = id + instance_no;
    const ImGuiTableFlags table_last_flags = table->Flags;
    if (instance_no > 0)
        IM_ASSERT(table->ColumnsCount == columns_count && "BeginTable(): Cannot change columns count mid-frame while preserving same ID");

    // Fix flags
    table->IsDefaultSizingPolicy = (flags & ImGuiTableFlags_SizingMask_) == 0;
    flags = TableFixFlags(flags, outer_window);

    // Initialize
    table->ID = id;
    table->Flags = flags;
    table->InstanceCurrent = (ImS16)instance_no;
    table->LastFrameActive = g.FrameCount;
    table->OuterWindow = table->InnerWindow = outer_window;
    table->ColumnsCount = columns_count;
    table->IsLayoutLocked = false;
    table->InnerWidth = inner_width;
    table->UserOuterSize = outer_size;

    // When not using a child window, WorkRect.Max will grow as we append contents.
    if (use_child_window)
    {
        // Ensure no vertical scrollbar appears if we only want horizontal one, to make flag consistent
        // (we have no other way to disable vertical scrollbar of a window while keeping the horizontal one showing)
        ImVec2 override_content_size(FLT_MAX, FLT_MAX);
        if ((flags & ImGuiTableFlags_ScrollX) && !(flags & ImGuiTableFlags_ScrollY))
            override_content_size.y = FLT_MIN;

        // Ensure specified width (when not specified, Stretched columns will act as if the width == OuterWidth and
        // never lead to any scrolling). We don't handle inner_width < 0.0f, we could potentially use it to right-align
        // based on the right side of the child window work rect, which would require knowing ahead if we are going to
        // have decoration taking horizontal spaces (typically a vertical scrollbar).
        if ((flags & ImGuiTableFlags_ScrollX) && inner_width > 0.0f)
            override_content_size.x = inner_width;

        if (override_content_size.x != FLT_MAX || override_content_size.y != FLT_MAX)
            SetNextWindowContentSize(ImVec2(override_content_size.x != FLT_MAX ? override_content_size.x : 0.0f, override_content_size.y != FLT_MAX ? override_content_size.y : 0.0f));

        // Reset scroll if we are reactivating it
        if ((table_last_flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) == 0)
            SetNextWindowScroll(ImVec2(0.0f, 0.0f));

        // Create scrolling region (without border and zero window padding)
        ImGuiWindowFlags child_flags = (flags & ImGuiTableFlags_ScrollX) ? ImGuiWindowFlags_HorizontalScrollbar : ImGuiWindowFlags_None;
        BeginChildEx(name, instance_id, outer_rect.GetSize(), false, child_flags);
        table->InnerWindow = g.CurrentWindow;
        table->WorkRect = table->InnerWindow->WorkRect;
        table->OuterRect = table->InnerWindow->Rect();
        table->InnerRect = table->InnerWindow->InnerRect;
        IM_ASSERT(table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f);
    }
    else
    {
        // For non-scrolling tables, WorkRect == OuterRect == InnerRect.
        // But at this point we do NOT have a correct value for .Max.y (unless a height has been explicitly passed in). It will only be updated in EndTable().
        table->WorkRect = table->OuterRect = table->InnerRect = outer_rect;
    }

    // Push a standardized ID for both child-using and not-child-using tables
    PushOverrideID(instance_id);

    // Backup a copy of host window members we will modify
    ImGuiWindow* inner_window = table->InnerWindow;
    table->HostIndentX = inner_window->DC.Indent.x;
    table->HostClipRect = inner_window->ClipRect;
    table->HostSkipItems = inner_window->SkipItems;
    table->HostBackupWorkRect = inner_window->WorkRect;
    table->HostBackupParentWorkRect = inner_window->ParentWorkRect;
    table->HostBackupColumnsOffset = outer_window->DC.ColumnsOffset;
    table->HostBackupPrevLineSize = inner_window->DC.PrevLineSize;
    table->HostBackupCurrLineSize = inner_window->DC.CurrLineSize;
    table->HostBackupCursorMaxPos = inner_window->DC.CursorMaxPos;
    table->HostBackupItemWidth = outer_window->DC.ItemWidth;
    table->HostBackupItemWidthStackSize = outer_window->DC.ItemWidthStack.Size;
    inner_window->DC.PrevLineSize = inner_window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);

    // Padding and Spacing
    // - None               ........Content..... Pad .....Content........
    // - PadOuter           | Pad ..Content..... Pad .....Content.. Pad |
    // - PadInner           ........Content.. Pad | Pad ..Content........
    // - PadOuter+PadInner  | Pad ..Content.. Pad | Pad ..Content.. Pad |
    const bool pad_outer_x = (flags & ImGuiTableFlags_NoPadOuterX) ? false : (flags & ImGuiTableFlags_PadOuterX) ? true : (flags & ImGuiTableFlags_BordersOuterV) != 0;
    const bool pad_inner_x = (flags & ImGuiTableFlags_NoPadInnerX) ? false : true;
    const float inner_spacing_for_border = (flags & ImGuiTableFlags_BordersInnerV) ? TABLE_BORDER_SIZE : 0.0f;
    const float inner_spacing_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) == 0) ? g.Style.CellPadding.x : 0.0f;
    const float inner_padding_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) != 0) ? g.Style.CellPadding.x : 0.0f;
    table->CellSpacingX1 = inner_spacing_explicit + inner_spacing_for_border;
    table->CellSpacingX2 = inner_spacing_explicit;
    table->CellPaddingX = inner_padding_explicit;
    table->CellPaddingY = g.Style.CellPadding.y;

    const float outer_padding_for_border = (flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
    const float outer_padding_explicit = pad_outer_x ? g.Style.CellPadding.x : 0.0f;
    table->OuterPaddingX = (outer_padding_for_border + outer_padding_explicit) - table->CellPaddingX;

    table->CurrentColumn = -1;
    table->CurrentRow = -1;
    table->RowBgColorCounter = 0;
    table->LastRowFlags = ImGuiTableRowFlags_None;
    table->InnerClipRect = (inner_window == outer_window) ? table->WorkRect : inner_window->ClipRect;
    table->InnerClipRect.ClipWith(table->WorkRect);     // We need this to honor inner_width
    table->InnerClipRect.ClipWithFull(table->HostClipRect);
    table->InnerClipRect.Max.y = (flags & ImGuiTableFlags_NoHostExtendY) ? ImMin(table->InnerClipRect.Max.y, inner_window->WorkRect.Max.y) : inner_window->ClipRect.Max.y;

    table->RowPosY1 = table->RowPosY2 = table->WorkRect.Min.y; // This is needed somehow
    table->RowTextBaseline = 0.0f; // This will be cleared again by TableBeginRow()
    table->FreezeRowsRequest = table->FreezeRowsCount = 0; // This will be setup by TableSetupScrollFreeze(), if any
    table->FreezeColumnsRequest = table->FreezeColumnsCount = 0;
    table->IsUnfrozenRows = true;
    table->DeclColumnsCount = 0;

    // Using opaque colors facilitate overlapping elements of the grid
    table->BorderColorStrong = GetColorU32(ImGuiCol_TableBorderStrong);
    table->BorderColorLight = GetColorU32(ImGuiCol_TableBorderLight);

    // Make table current
    const int table_idx = g.Tables.GetIndex(table);
    g.CurrentTableStack.push_back(ImGuiPtrOrIndex(table_idx));
    g.CurrentTable = table;
    outer_window->DC.CurrentTableIdx = table_idx;
    if (inner_window != outer_window) // So EndChild() within the inner window can restore the table properly.
        inner_window->DC.CurrentTableIdx = table_idx;

    if ((table_last_flags & ImGuiTableFlags_Reorderable) && (flags & ImGuiTableFlags_Reorderable) == 0)
        table->IsResetDisplayOrderRequest = true;

    // Mark as used
    if (table_idx >= g.TablesLastTimeActive.Size)
        g.TablesLastTimeActive.resize(table_idx + 1, -1.0f);
    g.TablesLastTimeActive[table_idx] = (float)g.Time;
    table->MemoryCompacted = false;

    // Setup memory buffer (clear data if columns count changed)
    const int stored_size = table->Columns.size();
    if (stored_size != 0 && stored_size != columns_count)
    {
        IM_FREE(table->RawData);
        table->RawData = NULL;
    }
    if (table->RawData == NULL)
    {
        TableBeginInitMemory(table, columns_count);
        table->IsInitializing = table->IsSettingsRequestLoad = true;
    }
    if (table->IsResetAllRequest)
        TableResetSettings(table);
    if (table->IsInitializing)
    {
        // Initialize
        table->SettingsOffset = -1;
        table->IsSortSpecsDirty = true;
        table->InstanceInteracted = -1;
        table->ContextPopupColumn = -1;
        table->ReorderColumn = table->ResizedColumn = table->LastResizedColumn = -1;
        table->AutoFitSingleColumn = -1;
        table->HoveredColumnBody = table->HoveredColumnBorder = -1;
        for (int n = 0; n < columns_count; n++)
        {
            ImGuiTableColumn* column = &table->Columns[n];
            float width_auto = column->WidthAuto;
            *column = ImGuiTableColumn();
            column->WidthAuto = width_auto;
            column->IsPreserveWidthAuto = true; // Preserve WidthAuto when reinitializing a live table: not technically necessary but remove a visible flicker
            column->DisplayOrder = table->DisplayOrderToIndex[n] = (ImGuiTableColumnIdx)n;
            column->IsEnabled = column->IsEnabledNextFrame = true;
        }
    }

    // Load settings
    if (table->IsSettingsRequestLoad)
        TableLoadSettings(table);

    // Handle DPI/font resize
    // This is designed to facilitate DPI changes with the assumption that e.g. style.CellPadding has been scaled as well.
    // It will also react to changing fonts with mixed results. It doesn't need to be perfect but merely provide a decent transition.
    // FIXME-DPI: Provide consistent standards for reference size. Perhaps using g.CurrentDpiScale would be more self explanatory.
    // This is will lead us to non-rounded WidthRequest in columns, which should work but is a poorly tested path.
    const float new_ref_scale_unit = g.FontSize; // g.Font->GetCharAdvance('A') ?
    if (table->RefScale != 0.0f && table->RefScale != new_ref_scale_unit)
    {
        const float scale_factor = new_ref_scale_unit / table->RefScale;
        //IMGUI_DEBUG_LOG("[table] %08X RefScaleUnit %.3f -> %.3f, scaling width by %.3f\n", table->ID, table->RefScaleUnit, new_ref_scale_unit, scale_factor);
        for (int n = 0; n < columns_count; n++)
            table->Columns[n].WidthRequest = table->Columns[n].WidthRequest * scale_factor;
    }
    table->RefScale = new_ref_scale_unit;

    // Disable output until user calls TableNextRow() or TableNextColumn() leading to the TableUpdateLayout() call..
    // This is not strictly necessary but will reduce cases were "out of table" output will be misleading to the user.
    // Because we cannot safely assert in EndTable() when no rows have been created, this seems like our best option.
    inner_window->SkipItems = true;

    // Clear names
    // At this point the ->NameOffset field of each column will be invalid until TableUpdateLayout() or the first call to TableSetupColumn()
    if (table->ColumnsNames.Buf.Size > 0)
        table->ColumnsNames.Buf.resize(0);

    // Apply queued resizing/reordering/hiding requests
    TableBeginApplyRequests(table);

    return true;
}